

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

bool __thiscall ImplicitDepLoader::LoadDeps(ImplicitDepLoader *this,Edge *edge,string *err)

{
  ulong uVar1;
  undefined1 local_a0 [8];
  string depfile;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string deps_type;
  string *err_local;
  Edge *edge_local;
  ImplicitDepLoader *this_local;
  
  deps_type.field_2._8_8_ = err;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"deps",&local_69);
  Edge::GetBinding((string *)local_48,edge,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = LoadDepsFromLog(this,edge,(string *)deps_type.field_2._8_8_);
    depfile.field_2._8_4_ = 1;
  }
  else {
    Edge::GetUnescapedDepfile_abi_cxx11_((string *)local_a0,edge);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      this_local._7_1_ = LoadDepFile(this,edge,(string *)local_a0,(string *)deps_type.field_2._8_8_)
      ;
    }
    else {
      this_local._7_1_ = true;
    }
    depfile.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_a0);
  }
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool ImplicitDepLoader::LoadDeps(Edge* edge, string* err) {
  string deps_type = edge->GetBinding("deps");
  if (!deps_type.empty())
    return LoadDepsFromLog(edge, err);

  string depfile = edge->GetUnescapedDepfile();
  if (!depfile.empty())
    return LoadDepFile(edge, depfile, err);

  // No deps to load.
  return true;
}